

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<float_*> * __thiscall
TPZVec<float_*>::operator=(TPZVec<float_*> *this,initializer_list<float_*> *list)

{
  iterator ppfVar1;
  size_type sVar2;
  float **ppfVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  ppfVar1 = list->_M_array;
  sVar2 = list->_M_len;
  ppfVar3 = this->fStore;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)ppfVar3 + lVar4) = *(undefined8 *)((long)ppfVar1 + lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}